

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O3

void duckdb::QuantileListOperation<duckdb::dtime_t,false>::
     Finalize<duckdb::list_entry_t,duckdb::QuantileState<duckdb::dtime_t,duckdb::QuantileStandardType>>
               (QuantileState<duckdb::dtime_t,_duckdb::QuantileStandardType> *state,
               list_entry_t *target,AggregateFinalizeData *finalize_data)

{
  AggregateInputData *this;
  long lVar1;
  dtime_t *v_t;
  size_type *psVar2;
  Vector *pVVar3;
  uint64_t uVar4;
  reference pvVar5;
  dtime_t dVar6;
  unsigned_long *q;
  size_type *psVar7;
  FunctionData *pFVar8;
  uint64_t uVar9;
  ulong uVar10;
  idx_t iVar11;
  double dVar12;
  undefined1 auVar13 [16];
  QuantileDirect<duckdb::dtime_t> local_a9;
  FunctionData *local_a8;
  list_entry_t *local_a0;
  AggregateFinalizeData *local_98;
  Vector *local_90;
  long local_88;
  FunctionData *local_80;
  Interpolator<false> local_78;
  double local_48;
  double dStack_40;
  
  if ((state->v).super_vector<duckdb::dtime_t,_std::allocator<duckdb::dtime_t>_>.
      super__Vector_base<duckdb::dtime_t,_std::allocator<duckdb::dtime_t>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (state->v).super_vector<duckdb::dtime_t,_std::allocator<duckdb::dtime_t>_>.
      super__Vector_base<duckdb::dtime_t,_std::allocator<duckdb::dtime_t>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    this = finalize_data->input;
    optional_ptr<duckdb::FunctionData,_true>::CheckValid(&this->bind_data);
    pFVar8 = (this->bind_data).ptr;
    pVVar3 = (Vector *)duckdb::ListVector::GetEntry(finalize_data->result);
    uVar4 = duckdb::ListVector::GetListSize(finalize_data->result);
    duckdb::ListVector::Reserve
              (finalize_data->result,
               (*(long *)(pFVar8 + 0x10) - *(long *)(pFVar8 + 8) >> 3) * 0x4ec4ec4ec4ec4ec5 + uVar4)
    ;
    lVar1 = *(long *)(pVVar3 + 0x20);
    v_t = (state->v).super_vector<duckdb::dtime_t,_std::allocator<duckdb::dtime_t>_>.
          super__Vector_base<duckdb::dtime_t,_std::allocator<duckdb::dtime_t>_>._M_impl.
          super__Vector_impl_data._M_start;
    target->offset = uVar4;
    psVar7 = *(size_type **)(pFVar8 + 0x20);
    psVar2 = *(size_type **)(pFVar8 + 0x28);
    if (psVar7 != psVar2) {
      local_80 = pFVar8 + 8;
      local_88 = lVar1 + uVar4 * 8;
      uVar10 = 0;
      local_a8 = pFVar8;
      local_a0 = target;
      local_98 = finalize_data;
      local_90 = pVVar3;
      do {
        pvVar5 = vector<duckdb::QuantileValue,_true>::operator[]
                           ((vector<duckdb::QuantileValue,_true> *)local_80,*psVar7);
        iVar11 = (long)(state->v).super_vector<duckdb::dtime_t,_std::allocator<duckdb::dtime_t>_>.
                       super__Vector_base<duckdb::dtime_t,_std::allocator<duckdb::dtime_t>_>._M_impl
                       .super__Vector_impl_data._M_finish -
                 (long)(state->v).super_vector<duckdb::dtime_t,_std::allocator<duckdb::dtime_t>_>.
                       super__Vector_base<duckdb::dtime_t,_std::allocator<duckdb::dtime_t>_>._M_impl
                       .super__Vector_impl_data._M_start >> 3;
        local_78.desc = *(bool *)(local_a8 + 0x38);
        lVar1 = iVar11 - 1;
        auVar13._8_4_ = (int)((ulong)lVar1 >> 0x20);
        auVar13._0_8_ = lVar1;
        auVar13._12_4_ = 0x45300000;
        dStack_40 = auVar13._8_8_ - 1.9342813113834067e+25;
        local_78.RN = (dStack_40 + ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) *
                      pvVar5->dbl;
        local_48 = local_78.RN;
        dVar12 = floor(local_78.RN);
        local_78.FRN = (long)(dVar12 - 9.223372036854776e+18) & (long)dVar12 >> 0x3f | (long)dVar12;
        dVar12 = ceil(local_48);
        local_78.CRN = (long)(dVar12 - 9.223372036854776e+18) & (long)dVar12 >> 0x3f | (long)dVar12;
        local_78.begin = uVar10;
        local_78.end = iVar11;
        dVar6 = Interpolator<false>::
                Operation<duckdb::dtime_t,duckdb::dtime_t,duckdb::QuantileDirect<duckdb::dtime_t>>
                          (&local_78,v_t,local_90,&local_a9);
        *(int64_t *)(local_88 + *psVar7 * 8) = dVar6.micros;
        psVar7 = psVar7 + 1;
        uVar10 = local_78.FRN;
      } while (psVar7 != psVar2);
      uVar4 = local_a0->offset;
      pFVar8 = local_a8;
      target = local_a0;
      finalize_data = local_98;
    }
    uVar9 = (*(long *)(pFVar8 + 0x10) - *(long *)(pFVar8 + 8) >> 3) * 0x4ec4ec4ec4ec4ec5;
    target->length = uVar9;
    duckdb::ListVector::SetListSize(finalize_data->result,uVar9 + uVar4);
    return;
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.v.empty()) {
			finalize_data.ReturnNull();
			return;
		}

		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->Cast<QuantileBindData>();

		auto &result = ListVector::GetEntry(finalize_data.result);
		auto ridx = ListVector::GetListSize(finalize_data.result);
		ListVector::Reserve(finalize_data.result, ridx + bind_data.quantiles.size());
		auto rdata = FlatVector::GetData<CHILD_TYPE>(result);

		auto v_t = state.v.data();
		D_ASSERT(v_t);

		auto &entry = target;
		entry.offset = ridx;
		idx_t lower = 0;
		for (const auto &q : bind_data.order) {
			const auto &quantile = bind_data.quantiles[q];
			Interpolator<DISCRETE> interp(quantile, state.v.size(), bind_data.desc);
			interp.begin = lower;
			rdata[ridx + q] = interp.template Operation<typename STATE::InputType, CHILD_TYPE>(v_t, result);
			lower = interp.FRN;
		}
		entry.length = bind_data.quantiles.size();

		ListVector::SetListSize(finalize_data.result, entry.offset + entry.length);
	}